

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *ctx;
  DrawRend *renderer;
  allocator<char> local_18a;
  allocator<char> local_189;
  Viewer viewer;
  _Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> local_168;
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> svgs;
  string local_138;
  DrawRend app;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
    poVar3 = std::operator<<(poVar3,
                             "Not enough arguments. Pass in an .svg or a directory of .svg files.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    loadPath(&svgs,argv[1]);
    if (svgs.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        svgs.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
      poVar3 = std::operator<<(poVar3,"No svg files successfully loaded. Exiting.");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::vector
                ((vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *)&local_168,&svgs);
      CGL::DrawRend::DrawRend(&app,(vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *)&local_168);
      std::_Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::~_Vector_base(&local_168);
      if ((uint)argc < 5) {
LAB_0016681e:
        CGL::Viewer::Viewer(&viewer);
        renderer = &app;
        CGL::Viewer::set_renderer(&viewer,&renderer->super_Renderer);
        CGL::Viewer::init(&viewer,(EVP_PKEY_CTX *)renderer);
        CGL::Viewer::start(&viewer);
        exit(0);
      }
      ctx = "nogl";
      iVar1 = strcmp(argv[2],"nogl");
      if (iVar1 != 0) goto LAB_0016681e;
      CGL::DrawRend::init(&app,(EVP_PKEY_CTX *)ctx);
      app.gl = false;
      std::__cxx11::string::string<std::allocator<char>>((string *)&viewer,argv[3],&local_189);
      iVar1 = std::__cxx11::stoi((string *)&viewer,(size_t *)0x0,10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,argv[4],&local_18a);
      iVar2 = std::__cxx11::stoi(&local_138,(size_t *)0x0,10);
      CGL::DrawRend::resize(&app,(long)iVar1,(long)iVar2);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&viewer);
      CGL::DrawRend::write_framebuffer(&app);
      CGL::DrawRend::~DrawRend(&app);
    }
    std::_Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::~_Vector_base
              (&svgs.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv ) {

  if (argc < 2) {
    msg("Not enough arguments. Pass in an .svg or a directory of .svg files.");
    return 0;
  }

  vector<SVG*> svgs(loadPath(argv[1]));
  if (svgs.empty()) {
    msg("No svg files successfully loaded. Exiting.");
    return 0;
  }

  // create application
  DrawRend app(svgs);

  if (argc > 4 && strcmp(argv[2],"nogl") == 0) {
    app.init();
    app.set_gl(false);
    app.resize(stoi(argv[3]), stoi(argv[4]));
    app.write_framebuffer();
    return 0;
  }

  // create viewer
  Viewer viewer = Viewer();

  // set renderer
  viewer.set_renderer(&app);

  // init viewer
  viewer.init();

  // start viewer
  viewer.start();

  exit(EXIT_SUCCESS);

  return 0;

}